

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O1

void __thiscall Executor::handlePrint(Executor *this,FunctionCallNode *node)

{
  Value *pVVar1;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  mapped_type *__rhs;
  long *plVar4;
  size_type *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  StringValueAnalyser analyser;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  long local_38 [2];
  char local_28;
  
  iVar2 = (*(node->super_CallNode).super_ExpressionNode.super_Node._vptr_Node[3])(node);
  plVar4 = *(long **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x10);
  (**(code **)(*plVar4 + 0x10))(plVar4,this);
  pVVar1 = (this->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
           super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
           super__Head_base<0UL,_Value_*,_false>._M_head_impl;
  if (pVVar1->valueType_ != String) {
    __rhs = std::__detail::
            _Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::at((_Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&TypeNameStrings_abi_cxx11_,&pVVar1->valueType_);
    std::operator+(&local_78,"Function print expected string, but got ",__rhs);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_78);
    local_58._M_dataplus._M_p = (pointer)*plVar4;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_58._M_dataplus._M_p == psVar5) {
      local_58.field_2._M_allocated_capacity = *psVar5;
      local_58.field_2._8_8_ = plVar4[3];
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    }
    else {
      local_58.field_2._M_allocated_capacity = *psVar5;
    }
    local_58._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    reportError(&local_58,(Node *)node);
  }
  local_58._M_dataplus._M_p = (pointer)&PTR__StringValueAnalyser_00157ce0;
  local_58._M_string_length = local_58._M_string_length & 0xffffffffffffff00;
  local_28 = '\0';
  (*pVVar1->_vptr_Value[3])(pVVar1);
  if (local_28 != '\0') {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,local_58.field_2._M_allocated_capacity,
               local_58.field_2._8_8_ + local_58.field_2._M_allocated_capacity);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&this->stdout_,local_78._M_dataplus._M_p,
                        local_78._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    local_58._M_dataplus._M_p = (pointer)&PTR__StringValueAnalyser_00157ce0;
    if (local_28 == '\x01') {
      local_28 = 0;
      if ((long *)local_58.field_2._M_allocated_capacity != local_38) {
        operator_delete((void *)local_58.field_2._M_allocated_capacity,local_38[0] + 1);
      }
    }
    return;
  }
  std::__throw_bad_optional_access();
}

Assistant:

void Executor::handlePrint(const FunctionCallNode& node)
{
  const auto& args = node.getArguments();
  (*args.begin())->accept(*this);

  if(value_->getType() != TypeName::String)
    reportError("Function print expected string, but got " +
      TypeNameStrings.at(value_->getType()) + "!", node);

  StringValueAnalyser analyser{};
  value_->accept(analyser);

  const auto str = analyser.getValue().value();
  stdout_ << str << "\n";
}